

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::InputFile::Data::deleteCachedBuffer(Data *this)

{
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  *this_00;
  iterator iVar1;
  Iterator IVar2;
  ArgExc *this_01;
  _Rb_tree_color *p_Var3;
  
  if (this->cachedBuffer != (FrameBuffer *)0x0) {
    for (iVar1._M_node = (_Base_ptr)FrameBuffer::begin(this->cachedBuffer);
        IVar2 = FrameBuffer::end(this->cachedBuffer), (iterator)iVar1._M_node != IVar2._i._M_node;
        iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node)) {
      switch(iVar1._M_node[9]._M_color) {
      case _S_red:
      case 2:
        if (iVar1._M_node[9]._M_parent != (_Base_ptr)0x0) {
          p_Var3 = &(iVar1._M_node[9]._M_parent)->_M_color + this->offset;
LAB_0018dc04:
          operator_delete__(p_Var3);
        }
        break;
      case _S_black:
        if (iVar1._M_node[9]._M_parent != (_Base_ptr)0x0) {
          p_Var3 = (_Rb_tree_color *)
                   ((long)&(iVar1._M_node[9]._M_parent)->_M_color + (long)this->offset * 2);
          goto LAB_0018dc04;
        }
        break;
      case 3:
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(this_01,"Invalid pixel type");
        __cxa_throw(this_01,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    this_00 = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)this->cachedBuffer;
    if (this_00 !=
        (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
         *)0x0) {
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree(this_00);
    }
    operator_delete(this_00,0x30);
    this->cachedBuffer = (FrameBuffer *)0x0;
  }
  return;
}

Assistant:

void
InputFile::Data::deleteCachedBuffer ()
{
    //
    // Delete the cached frame buffer, and all memory
    // allocated for the slices in the cached frameBuffer.
    //

    if (cachedBuffer)
    {
        for (FrameBuffer::Iterator k = cachedBuffer->begin ();
             k != cachedBuffer->end ();
             ++k)
        {
            Slice& s = k.slice ();

            switch (s.type)
            {
                case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                    delete[](((unsigned int*) s.base) + offset);
                    break;

                case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                    delete[]((half*) s.base + offset);
                    break;

                case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                    delete[](((float*) s.base) + offset);
                    break;
                case NUM_PIXELTYPES:
                    throw (IEX_NAMESPACE::ArgExc ("Invalid pixel type"));
            }
        }

        //
        // delete the cached frame buffer
        //

        delete cachedBuffer;
        cachedBuffer = 0;
    }
}